

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O2

void __thiscall Logger::~Logger(Logger *this)

{
  string *v;
  LogStream *pLVar1;
  Buffer *msg;
  
  pLVar1 = LogStream::operator<<((LogStream *)this," -- ");
  v = &(this->impl_).basename_;
  pLVar1 = LogStream::operator<<(pLVar1,v);
  pLVar1 = LogStream::operator<<(pLVar1,":");
  pLVar1 = LogStream::operator<<(pLVar1,(this->impl_).line_);
  LogStream::operator<<(pLVar1,"\n");
  msg = &(this->impl_).stream_.buffer_;
  output(msg->data_,*(int *)&(this->impl_).stream_.buffer_.cur_ - (int)msg);
  std::__cxx11::string::~string((string *)v);
  return;
}

Assistant:

Logger::~Logger() {
    impl_.stream_ << " -- " << impl_.basename_ << ":" << impl_.line_ << "\n";
    const LogStream::Buffer& buf(stream().buffer());
    output(buf.data(), buf.length());
}